

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void initCSharpData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  QMultiHash<char,_QLatin1String> QVar4;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar5;
  long lVar6;
  char local_7d9;
  QMultiHash<char,_QLatin1String> local_7d8;
  iterator local_7c8;
  undefined1 local_7b0 [16];
  char *local_7a0;
  undefined1 local_798;
  undefined8 local_790;
  char *local_788;
  undefined1 local_780;
  undefined8 local_778;
  char *local_770;
  undefined1 local_768;
  undefined8 local_760;
  char *local_758;
  undefined1 local_750;
  undefined8 local_748;
  char *local_740;
  undefined1 local_738;
  undefined8 local_730;
  char *local_728;
  undefined1 local_720;
  undefined8 local_718;
  char *local_710;
  undefined1 local_708;
  undefined8 local_700;
  char *local_6f8;
  undefined1 local_6f0;
  undefined8 local_6e8;
  char *local_6e0;
  undefined1 local_6d8;
  undefined8 local_6d0;
  char *local_6c8;
  undefined1 local_6c0;
  undefined8 local_6b8;
  char *local_6b0;
  undefined1 local_6a8;
  undefined8 local_6a0;
  char *local_698;
  undefined1 local_690;
  undefined8 local_688;
  char *local_680;
  undefined1 local_678;
  undefined8 local_670;
  char *local_668;
  undefined1 local_660;
  undefined8 local_658;
  char *local_650;
  undefined1 local_648;
  undefined8 local_640;
  char *local_638;
  undefined1 local_630;
  undefined8 local_628;
  char *local_620;
  undefined1 local_618;
  undefined8 local_610;
  char *local_608;
  undefined1 local_600;
  undefined8 local_5f8;
  char *local_5f0;
  undefined1 local_5e8;
  undefined8 local_5e0;
  char *local_5d8;
  undefined1 local_5d0;
  undefined8 local_5c8;
  char *local_5c0;
  undefined1 local_5b8;
  undefined8 local_5b0;
  char *local_5a8;
  undefined1 local_5a0;
  undefined8 local_598;
  char *local_590;
  undefined1 local_588;
  undefined8 local_580;
  char *local_578;
  undefined1 local_570;
  undefined8 local_568;
  char *local_560;
  undefined1 local_558;
  undefined8 local_550;
  char *local_548;
  undefined1 local_540;
  undefined8 local_538;
  char *local_530;
  undefined1 local_528;
  undefined8 local_520;
  char *local_518;
  undefined1 local_510;
  undefined8 local_508;
  char *local_500;
  undefined1 local_4f8;
  undefined8 local_4f0;
  char *local_4e8;
  undefined1 local_4e0;
  undefined8 local_4d8;
  char *local_4d0;
  undefined1 local_4c8;
  undefined8 local_4c0;
  char *local_4b8;
  undefined1 local_4b0;
  undefined8 local_4a8;
  char *local_4a0;
  undefined1 local_498;
  undefined8 local_490;
  char *local_488;
  undefined1 local_480;
  undefined8 local_478;
  char *local_470;
  undefined1 local_468;
  undefined8 local_460;
  char *local_458;
  undefined1 local_450;
  undefined8 local_448;
  char *local_440;
  undefined1 local_438;
  undefined8 local_430;
  char *local_428;
  undefined1 local_420;
  undefined8 local_418;
  char *local_410;
  undefined1 local_408;
  undefined8 local_400;
  char *local_3f8;
  undefined1 local_3f0;
  undefined8 local_3e8;
  char *local_3e0;
  undefined1 local_3d8;
  undefined8 local_3d0;
  char *local_3c8;
  undefined1 local_3c0;
  undefined8 local_3b8;
  char *local_3b0;
  undefined1 local_3a8;
  undefined8 local_3a0;
  char *local_398;
  undefined1 local_390;
  undefined8 local_388;
  char *local_380;
  undefined1 local_378;
  undefined8 local_370;
  char *local_368;
  undefined1 local_360;
  undefined8 local_358;
  char *local_350;
  undefined1 local_348;
  undefined8 local_340;
  char *local_338;
  undefined1 local_330;
  undefined8 local_328;
  char *local_320;
  undefined1 local_318;
  undefined8 local_310;
  char *local_308;
  undefined1 local_300;
  undefined8 local_2f8;
  char *local_2f0;
  undefined1 local_2e8;
  undefined8 local_2e0;
  char *local_2d8;
  undefined1 local_2d0;
  undefined8 local_2c8;
  char *local_2c0;
  undefined1 local_2b8;
  undefined8 local_2b0;
  char *local_2a8;
  undefined1 local_2a0;
  undefined8 local_298;
  char *local_290;
  undefined1 local_288;
  undefined8 local_280;
  char *local_278;
  undefined1 local_270;
  undefined8 local_268;
  char *local_260;
  undefined1 local_258;
  undefined8 local_250;
  char *local_248;
  undefined1 local_240;
  undefined8 local_238;
  char *local_230;
  undefined1 local_228;
  undefined8 local_220;
  char *local_218;
  undefined1 local_210;
  undefined8 local_208;
  char *local_200;
  undefined1 local_1f8;
  undefined8 local_1f0;
  char *local_1e8;
  undefined1 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined1 local_1c8;
  undefined8 local_1c0;
  char *local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  undefined1 local_198;
  undefined8 local_190;
  char *local_188;
  undefined1 local_180;
  undefined8 local_178;
  char *local_170;
  undefined1 local_168;
  undefined8 local_160;
  char *local_158;
  undefined1 local_150;
  undefined8 local_148;
  char *local_140;
  undefined1 local_138;
  undefined8 local_130;
  char *local_128;
  undefined1 local_120;
  undefined8 local_118;
  char *local_110;
  undefined1 local_108;
  undefined8 local_100;
  char *local_f8;
  undefined1 local_f0;
  undefined8 local_e8;
  char *local_e0;
  undefined1 local_d8;
  undefined8 local_d0;
  char *local_c8;
  undefined1 local_c0;
  undefined8 local_b8;
  char *local_b0;
  undefined1 local_a8;
  undefined8 local_a0;
  char *local_98;
  undefined1 local_90;
  undefined8 local_88;
  char *local_80;
  undefined1 local_78;
  undefined8 local_70;
  char *local_68;
  undefined1 local_60;
  undefined8 local_58;
  char *local_50;
  undefined1 local_48;
  undefined8 local_40;
  char *local_38;
  
  local_7b0[0] = 0x61;
  local_7b0._8_8_ = 8;
  local_7a0 = "abstract";
  local_798 = 0x61;
  local_790 = 3;
  local_788 = "add";
  local_780 = 0x61;
  local_778 = 5;
  local_770 = "alias";
  local_768 = 0x61;
  local_760 = 2;
  local_758 = "as";
  local_750 = 0x61;
  local_748 = 9;
  local_740 = "ascending";
  local_738 = 0x61;
  local_730 = 5;
  local_728 = "async";
  local_720 = 0x61;
  local_718 = 5;
  local_710 = "await";
  local_708 = 0x62;
  local_700 = 4;
  local_6f8 = "base";
  local_6f0 = 0x62;
  local_6e8 = 5;
  local_6e0 = "break";
  local_6d8 = 99;
  local_6d0 = 4;
  local_6c8 = "case";
  local_6c0 = 99;
  local_6b8 = 5;
  local_6b0 = "catch";
  local_6a8 = 99;
  local_6a0 = 7;
  local_698 = "checked";
  local_690 = 99;
  local_688 = 5;
  local_680 = "const";
  local_678 = 99;
  local_670 = 8;
  local_668 = "continue";
  local_660 = 100;
  local_658 = 7;
  local_650 = "decimal";
  local_648 = 100;
  local_640 = 7;
  local_638 = "default";
  local_630 = 100;
  local_628 = 8;
  local_620 = "delegate";
  local_618 = 100;
  local_610 = 10;
  local_608 = "descending";
  local_600 = 100;
  local_5f8 = 2;
  local_5f0 = "do";
  local_5e8 = 100;
  local_5e0 = 7;
  local_5d8 = "dynamic";
  local_5d0 = 0x65;
  local_5c8 = 4;
  local_5c0 = "else";
  local_5b8 = 0x65;
  local_5b0 = 5;
  local_5a8 = "event";
  local_5a0 = 0x65;
  local_598 = 8;
  local_590 = "explicit";
  local_588 = 0x65;
  local_580 = 6;
  local_578 = "extern";
  local_570 = 0x66;
  local_568 = 7;
  local_560 = "finally";
  local_558 = 0x66;
  local_550 = 5;
  local_548 = "fixed";
  local_540 = 0x66;
  local_538 = 3;
  local_530 = "for";
  local_528 = 0x66;
  local_520 = 7;
  local_518 = "foreach";
  local_510 = 0x66;
  local_508 = 4;
  local_500 = "from";
  local_4f8 = 0x67;
  local_4f0 = 3;
  local_4e8 = "get";
  local_4e0 = 0x67;
  local_4d8 = 6;
  local_4d0 = "global";
  local_4c8 = 0x67;
  local_4c0 = 4;
  local_4b8 = "goto";
  local_4b0 = 0x67;
  local_4a8 = 5;
  local_4a0 = "group";
  local_498 = 0x69;
  local_490 = 2;
  local_488 = "if";
  local_480 = 0x69;
  local_478 = 8;
  local_470 = "implicit";
  local_468 = 0x69;
  local_460 = 2;
  local_458 = "in";
  local_450 = 0x69;
  local_448 = 9;
  local_440 = "interface";
  local_438 = 0x69;
  local_430 = 8;
  local_428 = "internal";
  local_420 = 0x69;
  local_418 = 4;
  local_410 = "into";
  local_408 = 0x69;
  local_400 = 2;
  local_3f8 = "is";
  local_3f0 = 0x6a;
  local_3e8 = 4;
  local_3e0 = "join";
  local_3d8 = 0x6c;
  local_3d0 = 3;
  local_3c8 = "let";
  local_3c0 = 0x6c;
  local_3b8 = 4;
  local_3b0 = "lock";
  local_3a8 = 0x6c;
  local_3a0 = 4;
  local_398 = "long";
  local_390 = 0x6e;
  local_388 = 9;
  local_380 = "namespace";
  local_378 = 0x6e;
  local_370 = 3;
  local_368 = "new";
  local_360 = 0x6f;
  local_358 = 6;
  local_350 = "object";
  local_348 = 0x6f;
  local_340 = 8;
  local_338 = "operator";
  local_330 = 0x6f;
  local_328 = 7;
  local_320 = "orderby";
  local_318 = 0x6f;
  local_310 = 3;
  local_308 = "out";
  local_300 = 0x6f;
  local_2f8 = 8;
  local_2f0 = "override";
  local_2e8 = 0x70;
  local_2e0 = 6;
  local_2d8 = "params";
  local_2d0 = 0x70;
  local_2c8 = 7;
  local_2c0 = "partial";
  local_2b8 = 0x70;
  local_2b0 = 7;
  local_2a8 = "private";
  local_2a0 = 0x70;
  local_298 = 9;
  local_290 = "protected";
  local_288 = 0x70;
  local_280 = 6;
  local_278 = "public";
  local_270 = 0x72;
  local_268 = 8;
  local_260 = "readonly";
  local_258 = 0x72;
  local_250 = 3;
  local_248 = "ref";
  local_240 = 0x72;
  local_238 = 6;
  local_230 = "remove";
  local_228 = 0x72;
  local_220 = 6;
  local_218 = "return";
  local_210 = 0x73;
  local_208 = 6;
  local_200 = "sealed";
  local_1f8 = 0x73;
  local_1f0 = 6;
  local_1e8 = "select";
  local_1e0 = 0x73;
  local_1d8 = 3;
  local_1d0 = "set";
  local_1c8 = 0x73;
  local_1c0 = 6;
  local_1b8 = "sizeof";
  local_1b0 = 0x73;
  local_1a8 = 10;
  local_1a0 = "stackalloc";
  local_198 = 0x73;
  local_190 = 6;
  local_188 = "static";
  local_180 = 0x73;
  local_178 = 6;
  local_170 = "switch";
  local_168 = 0x74;
  local_160 = 4;
  local_158 = "this";
  local_150 = 0x74;
  local_148 = 5;
  local_140 = "throw";
  local_138 = 0x74;
  local_130 = 3;
  local_128 = "try";
  local_120 = 0x74;
  local_118 = 6;
  local_110 = "typeof";
  local_108 = 0x75;
  local_100 = 9;
  local_f8 = "unchecked";
  local_f0 = 0x75;
  local_e8 = 6;
  local_e0 = "unsafe";
  local_d8 = 0x75;
  local_d0 = 5;
  local_c8 = "using";
  local_c0 = 0x76;
  local_b8 = 5;
  local_b0 = "value";
  local_a8 = 0x76;
  local_a0 = 7;
  local_98 = "virtual";
  local_90 = 0x76;
  local_88 = 8;
  local_80 = "volatile";
  local_78 = 0x77;
  local_70 = 5;
  local_68 = "where";
  local_60 = 0x77;
  local_58 = 5;
  local_50 = "while";
  local_48 = 0x79;
  local_40 = 5;
  local_38 = "yield";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x50);
  local_7d8.m_size = 0;
  lVar6 = 0;
  local_7d8.d = pDVar5;
  do {
    local_7d9 = local_7b0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7c8,&local_7d8,&local_7d9,(QLatin1String *)(local_7b0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x780);
  QVar1.m_size = local_7d8.m_size;
  QVar1.d = local_7d8.d;
  local_7d8.d = (Data *)0x0;
  local_7d8.m_size = 0;
  local_7c8.i.d = csharp_keywords.d;
  local_7c8.i.bucket = csharp_keywords.m_size;
  csharp_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7d8);
  local_7b0[0] = 0x62;
  local_7b0._8_8_ = 4;
  local_7a0 = "bool";
  local_798 = 0x62;
  local_790 = 4;
  local_788 = "byte";
  local_780 = 99;
  local_778 = 4;
  local_770 = "char";
  local_768 = 99;
  local_760 = 5;
  local_758 = "class";
  local_750 = 100;
  local_748 = 6;
  local_740 = "double";
  local_738 = 0x65;
  local_730 = 4;
  local_728 = "enum";
  local_720 = 0x66;
  local_718 = 5;
  local_710 = "float";
  local_708 = 0x69;
  local_700 = 3;
  local_6f8 = "int";
  local_6f0 = 0x73;
  local_6e8 = 5;
  local_6e0 = "sbyte";
  local_6d8 = 0x73;
  local_6d0 = 5;
  local_6c8 = "short";
  local_6c0 = 0x73;
  local_6b8 = 6;
  local_6b0 = "string";
  local_6a8 = 0x73;
  local_6a0 = 6;
  local_698 = "struct";
  local_690 = 0x75;
  local_688 = 4;
  local_680 = "uint";
  local_678 = 0x75;
  local_670 = 5;
  local_668 = "ulong";
  local_660 = 0x75;
  local_658 = 6;
  local_650 = "ushort";
  local_648 = 0x76;
  local_640 = 3;
  local_638 = "var";
  local_630 = 0x76;
  local_628 = 4;
  local_620 = "void";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x11);
  local_7d8.m_size = 0;
  lVar6 = 0;
  local_7d8.d = pDVar5;
  do {
    local_7d9 = local_7b0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7c8,&local_7d8,&local_7d9,(QLatin1String *)(local_7b0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x198);
  QVar2.m_size = local_7d8.m_size;
  QVar2.d = local_7d8.d;
  local_7d8.d = (Data *)0x0;
  local_7d8.m_size = 0;
  local_7c8.i.d = csharp_types.d;
  local_7c8.i.bucket = csharp_types.m_size;
  csharp_types = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7d8);
  local_7b0[0] = 0x66;
  local_7b0._8_8_ = 5;
  local_7a0 = "false";
  local_798 = 0x74;
  local_790 = 4;
  local_788 = "true";
  local_780 = 0x6e;
  local_778 = 4;
  local_770 = "null";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,3);
  local_7d8.m_size = 0;
  lVar6 = 0;
  local_7d8.d = pDVar5;
  do {
    local_7d9 = local_7b0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7c8,&local_7d8,&local_7d9,(QLatin1String *)(local_7b0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  QVar3.m_size = local_7d8.m_size;
  QVar3.d = local_7d8.d;
  local_7d8.d = (Data *)0x0;
  local_7d8.m_size = 0;
  local_7c8.i.d = csharp_literals.d;
  local_7c8.i.bucket = csharp_literals.m_size;
  csharp_literals = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7d8);
  local_7c8.i = (piter)ZEXT816(0);
  local_7b0._0_8_ = csharp_builtin.d;
  local_7b0._8_8_ = csharp_builtin.m_size;
  csharp_builtin = (QMultiHash<char,_QLatin1String>)ZEXT816(0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_7b0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c8);
  local_7b0[0] = 100;
  local_7b0._8_8_ = 6;
  local_7a0 = "define";
  local_798 = 0x65;
  local_790 = 4;
  local_788 = "elif";
  local_780 = 0x65;
  local_778 = 4;
  local_770 = "else";
  local_768 = 0x65;
  local_760 = 5;
  local_758 = "endif";
  local_750 = 0x65;
  local_748 = 9;
  local_740 = "endregion";
  local_738 = 0x65;
  local_730 = 5;
  local_728 = "error";
  local_720 = 0x69;
  local_718 = 2;
  local_710 = "if";
  local_708 = 0x6c;
  local_700 = 4;
  local_6f8 = "line";
  local_6f0 = 0x70;
  local_6e8 = 6;
  local_6e0 = "pragma";
  local_6d8 = 0x72;
  local_6d0 = 6;
  local_6c8 = "region";
  local_6c0 = 0x75;
  local_6b8 = 5;
  local_6b0 = "undef";
  local_6a8 = 0x77;
  local_6a0 = 7;
  local_698 = "warning";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0xc);
  local_7d8.m_size = 0;
  lVar6 = 0;
  local_7d8.d = pDVar5;
  do {
    local_7d9 = local_7b0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_7c8,&local_7d8,&local_7d9,(QLatin1String *)(local_7b0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x120);
  QVar4.m_size = local_7d8.m_size;
  QVar4.d = local_7d8.d;
  local_7d8.d = (Data *)0x0;
  local_7d8.m_size = 0;
  local_7c8.i.d = csharp_other.d;
  local_7c8.i.bucket = csharp_other.m_size;
  csharp_other = QVar4;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_7c8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_7d8);
  return;
}

Assistant:

void initCSharpData() {
    csharp_keywords = {{('a'), QLatin1String("abstract")},
                       {('a'), QLatin1String("add")},
                       {('a'), QLatin1String("alias")},
                       {('a'), QLatin1String("as")},
                       {('a'), QLatin1String("ascending")},
                       {('a'), QLatin1String("async")},
                       {('a'), QLatin1String("await")},
                       {('b'), QLatin1String("base")},
                       {('b'), QLatin1String("break")},
                       {('c'), QLatin1String("case")},
                       {('c'), QLatin1String("catch")},
                       {('c'), QLatin1String("checked")},
                       {('c'), QLatin1String("const")},
                       {('c'), QLatin1String("continue")},
                       {('d'), QLatin1String("decimal")},
                       {('d'), QLatin1String("default")},
                       {('d'), QLatin1String("delegate")},
                       {('d'), QLatin1String("descending")},
                       {('d'), QLatin1String("do")},
                       {('d'), QLatin1String("dynamic")},
                       {('e'), QLatin1String("else")},
                       {('e'), QLatin1String("event")},
                       {('e'), QLatin1String("explicit")},
                       {('e'), QLatin1String("extern")},
                       {('f'), QLatin1String("finally")},
                       {('f'), QLatin1String("fixed")},
                       {('f'), QLatin1String("for")},
                       {('f'), QLatin1String("foreach")},
                       {('f'), QLatin1String("from")},
                       {('g'), QLatin1String("get")},
                       {('g'), QLatin1String("global")},
                       {('g'), QLatin1String("goto")},
                       {('g'), QLatin1String("group")},
                       {('i'), QLatin1String("if")},
                       {('i'), QLatin1String("implicit")},
                       {('i'), QLatin1String("in")},
                       {('i'), QLatin1String("interface")},
                       {('i'), QLatin1String("internal")},
                       {('i'), QLatin1String("into")},
                       {('i'), QLatin1String("is")},
                       {('j'), QLatin1String("join")},
                       {('l'), QLatin1String("let")},
                       {('l'), QLatin1String("lock")},
                       {('l'), QLatin1String("long")},
                       {('n'), QLatin1String("namespace")},
                       {('n'), QLatin1String("new")},
                       {('o'), QLatin1String("object")},
                       {('o'), QLatin1String("operator")},
                       {('o'), QLatin1String("orderby")},
                       {('o'), QLatin1String("out")},
                       {('o'), QLatin1String("override")},
                       {('p'), QLatin1String("params")},
                       {('p'), QLatin1String("partial")},
                       {('p'), QLatin1String("private")},
                       {('p'), QLatin1String("protected")},
                       {('p'), QLatin1String("public")},
                       {('r'), QLatin1String("readonly")},
                       {('r'), QLatin1String("ref")},
                       {('r'), QLatin1String("remove")},
                       {('r'), QLatin1String("return")},
                       {('s'), QLatin1String("sealed")},
                       {('s'), QLatin1String("select")},
                       {('s'), QLatin1String("set")},
                       {('s'), QLatin1String("sizeof")},
                       {('s'), QLatin1String("stackalloc")},
                       {('s'), QLatin1String("static")},
                       {('s'), QLatin1String("switch")},
                       {('t'), QLatin1String("this")},
                       {('t'), QLatin1String("throw")},
                       {('t'), QLatin1String("try")},
                       {('t'), QLatin1String("typeof")},
                       {('u'), QLatin1String("unchecked")},
                       {('u'), QLatin1String("unsafe")},
                       {('u'), QLatin1String("using")},
                       {('v'), QLatin1String("value")},
                       {('v'), QLatin1String("virtual")},
                       {('v'), QLatin1String("volatile")},
                       {('w'), QLatin1String("where")},
                       {('w'), QLatin1String("while")},
                       {('y'), QLatin1String("yield")}};

    csharp_types = {
        {('b'), QLatin1String("bool")},   {('b'), QLatin1String("byte")},
        {('c'), QLatin1String("char")},   {('c'), QLatin1String("class")},
        {('d'), QLatin1String("double")}, {('e'), QLatin1String("enum")},
        {('f'), QLatin1String("float")},  {('i'), QLatin1String("int")},
        {('s'), QLatin1String("sbyte")},  {('s'), QLatin1String("short")},
        {('s'), QLatin1String("string")}, {('s'), QLatin1String("struct")},
        {('u'), QLatin1String("uint")},   {('u'), QLatin1String("ulong")},
        {('u'), QLatin1String("ushort")}, {('v'), QLatin1String("var")},
        {('v'), QLatin1String("void")},
    };

    csharp_literals = {{('f'), QLatin1String("false")},
                       {('t'), QLatin1String("true")},
                       {('n'), QLatin1String("null")}};

    csharp_builtin = {

    };

    csharp_other = {
        {('d'), QLatin1String("define")},    {('e'), QLatin1String("elif")},
        {('e'), QLatin1String("else")},      {('e'), QLatin1String("endif")},
        {('e'), QLatin1String("endregion")}, {('e'), QLatin1String("error")},
        {('i'), QLatin1String("if")},        {('l'), QLatin1String("line")},
        {('p'), QLatin1String("pragma")},    {('r'), QLatin1String("region")},
        {('u'), QLatin1String("undef")},     {('w'), QLatin1String("warning")}};
}